

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtrans.c
# Opt level: O0

void png_do_invert(png_row_infop row_info,png_bytep row)

{
  ulong uVar1;
  size_t istop_2;
  size_t i_2;
  png_bytep rp_2;
  size_t istop_1;
  size_t i_1;
  png_bytep rp_1;
  size_t istop;
  size_t i;
  png_bytep rp;
  png_bytep row_local;
  png_row_infop row_info_local;
  
  if (row_info->color_type == '\0') {
    uVar1 = row_info->rowbytes;
    i = (size_t)row;
    for (istop = 0; istop < uVar1; istop = istop + 1) {
      *(byte *)i = *(byte *)i ^ 0xff;
      i = i + 1;
    }
  }
  else if ((row_info->color_type == '\x04') && (row_info->bit_depth == '\b')) {
    uVar1 = row_info->rowbytes;
    i_1 = (size_t)row;
    for (istop_1 = 0; istop_1 < uVar1; istop_1 = istop_1 + 2) {
      *(byte *)i_1 = *(byte *)i_1 ^ 0xff;
      i_1 = i_1 + 2;
    }
  }
  else if ((row_info->color_type == '\x04') && (row_info->bit_depth == '\x10')) {
    uVar1 = row_info->rowbytes;
    i_2 = (size_t)row;
    for (istop_2 = 0; istop_2 < uVar1; istop_2 = istop_2 + 4) {
      *(byte *)i_2 = *(byte *)i_2 ^ 0xff;
      *(byte *)(i_2 + 1) = *(byte *)(i_2 + 1) ^ 0xff;
      i_2 = i_2 + 4;
    }
  }
  return;
}

Assistant:

void /* PRIVATE */
png_do_invert(png_row_infop row_info, png_bytep row)
{
   png_debug(1, "in png_do_invert");

  /* This test removed from libpng version 1.0.13 and 1.2.0:
   *   if (row_info->bit_depth == 1 &&
   */
   if (row_info->color_type == PNG_COLOR_TYPE_GRAY)
   {
      png_bytep rp = row;
      size_t i;
      size_t istop = row_info->rowbytes;

      for (i = 0; i < istop; i++)
      {
         *rp = (png_byte)(~(*rp));
         rp++;
      }
   }

   else if (row_info->color_type == PNG_COLOR_TYPE_GRAY_ALPHA &&
      row_info->bit_depth == 8)
   {
      png_bytep rp = row;
      size_t i;
      size_t istop = row_info->rowbytes;

      for (i = 0; i < istop; i += 2)
      {
         *rp = (png_byte)(~(*rp));
         rp += 2;
      }
   }

#ifdef PNG_16BIT_SUPPORTED
   else if (row_info->color_type == PNG_COLOR_TYPE_GRAY_ALPHA &&
      row_info->bit_depth == 16)
   {
      png_bytep rp = row;
      size_t i;
      size_t istop = row_info->rowbytes;

      for (i = 0; i < istop; i += 4)
      {
         *rp = (png_byte)(~(*rp));
         *(rp + 1) = (png_byte)(~(*(rp + 1)));
         rp += 4;
      }
   }
#endif
}